

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_interpolator_tests.cpp
# Opt level: O0

void process<ear::dsp::GainInterpolator<ear::dsp::LinearInterpVector>>
               (GainInterpolator<ear::dsp::LinearInterpVector> *interp,SampleIndex block_start,
               Ref<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *in,
               Ref<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *out)

{
  size_t sVar1;
  float **in_00;
  float **out_00;
  undefined1 local_68 [8];
  PtrAdapter out_p;
  undefined1 local_40 [8];
  PtrAdapterConst in_p;
  Ref<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *out_local;
  Ref<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *in_local;
  SampleIndex block_start_local;
  GainInterpolator<ear::dsp::LinearInterpVector> *interp_local;
  
  in_p._ptrs.super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)out;
  sVar1 = Eigen::
          MapBase<Eigen::Ref<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>
          ::cols((MapBase<Eigen::Ref<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  *)in);
  ear::dsp::PtrAdapterT<const_float_*>::PtrAdapterT((PtrAdapterT<const_float_*> *)local_40,sVar1);
  ear::dsp::PtrAdapterT<float_const*>::
  set_eigen<Eigen::Ref<Eigen::Matrix<float,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>>const&>
            ((PtrAdapterT<float_const*> *)local_40,in,0);
  sVar1 = Eigen::
          MapBase<Eigen::Ref<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>
          ::cols((MapBase<Eigen::Ref<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  *)out);
  ear::dsp::PtrAdapterT<float_*>::PtrAdapterT((PtrAdapterT<float_*> *)local_68,sVar1);
  ear::dsp::PtrAdapterT<float*>::
  set_eigen<Eigen::Ref<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>&>
            ((PtrAdapterT<float*> *)local_68,out,0);
  sVar1 = Eigen::
          MapBase<Eigen::Ref<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>
          ::rows((MapBase<Eigen::Ref<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  *)in);
  in_00 = ear::dsp::PtrAdapterT<const_float_*>::ptrs((PtrAdapterT<const_float_*> *)local_40);
  out_00 = ear::dsp::PtrAdapterT<float_*>::ptrs((PtrAdapterT<float_*> *)local_68);
  ear::dsp::GainInterpolator<ear::dsp::LinearInterpVector>::process
            (interp,block_start,sVar1,in_00,out_00);
  ear::dsp::PtrAdapterT<float_*>::~PtrAdapterT((PtrAdapterT<float_*> *)local_68);
  ear::dsp::PtrAdapterT<const_float_*>::~PtrAdapterT((PtrAdapterT<const_float_*> *)local_40);
  return;
}

Assistant:

void process(Interp &interp, SampleIndex block_start,
             const Eigen::Ref<const Eigen::MatrixXf> &in,
             Eigen::Ref<Eigen::MatrixXf> out) {
  PtrAdapterConst in_p(in.cols());
  in_p.set_eigen(in);
  PtrAdapter out_p(out.cols());
  out_p.set_eigen(out);

  interp.process(block_start, in.rows(), in_p.ptrs(), out_p.ptrs());
}